

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3Codec.cpp
# Opt level: O1

uint8_t * MP3Codec::mp3FindFrame(uint8_t *buff,uint8_t *end)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t *unaff_R15;
  bool bVar3;
  
  if (buff < end + -4 && buff != (uint8_t *)0x0) {
    puVar2 = end + (-4 - (long)buff);
    do {
      uVar1 = my_ntohl(*(uint32_t *)buff);
      bVar3 = true;
      if (((((~uVar1 & 0xf000) != 0) && (0xffdfffff < uVar1)) && ((uVar1 & 0x60000) != 0)) &&
         (bVar3 = (~uVar1 & 0xc00) == 0, !bVar3)) {
        unaff_R15 = (uint32_t *)buff;
      }
      if (!bVar3) {
        return (uint8_t *)unaff_R15;
      }
      buff = (uint8_t *)((long)buff + 1);
      puVar2 = puVar2 + -1;
    } while (puVar2 != (uint8_t *)0x0);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* MP3Codec::mp3FindFrame(uint8_t* buff, const uint8_t* end)
{
    if (buff == nullptr)
        return nullptr;
    // header
    for (uint8_t* cur = buff; cur < end - 4; cur++)
    {
        const uint32_t header = my_ntohl(*reinterpret_cast<uint32_t*>(cur));
        if ((header & 0xffe00000) != 0xffe00000)
            continue;
        // layer check
        if ((header & (3 << 17)) == 0)
            continue;
        // bit rate
        if ((header & (0xf << 12)) == 0xf << 12)
            continue;
        // frequency
        if ((header & (3 << 10)) == 3 << 10)
            continue;
        return cur;
    }
    return nullptr;
}